

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QueuePage_*>::end(QList<QueuePage_*> *this)

{
  QueuePage **n;
  QArrayDataPointer<QueuePage_*> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<QueuePage_*> *in_stack_ffffffffffffffe0;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QueuePage_*> *)0x6d5c39);
  QArrayDataPointer<QueuePage_*>::operator->(in_RDI);
  n = QArrayDataPointer<QueuePage_*>::end(in_stack_ffffffffffffffe0);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator end() { detach(); return iterator(d->end()); }